

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O0

size_t __thiscall pstore::repo::fragment::size_bytes(fragment *this)

{
  section_kind kind;
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  pointer pdVar4;
  undefined4 extraout_var;
  not_null<std::aligned_storage<16UL,_8UL>::type_*> local_50;
  unique_ptr<pstore::repo::dispatcher,_(anonymous_namespace)::nop_deleter> local_48 [2];
  size_t last_section_size;
  dispatcher_buffer buffer;
  value_type vStack_20;
  section_kind last_section_kind;
  value_type last_offset;
  fragment *this_local;
  
  last_offset = (value_type)this;
  sVar2 = section_sparray<unsigned_long>::size(&this->arr_);
  if (sVar2 == 0) {
    this_local = (fragment *)0x20;
  }
  else {
    pvVar3 = section_sparray<unsigned_long>::back(&this->arr_);
    vStack_20 = *pvVar3;
    buffer._8_4_ = section_sparray<unsigned_long>::get_indices(&this->arr_);
    kind = section_sparray<unsigned_long>::indices::back((indices *)(buffer.__data + 8));
    buffer.__data[0xf] = kind;
    gsl::not_null<std::aligned_storage<16UL,_8UL>::type_*>::not_null
              (&local_50,(type *)&last_section_size);
    anon_unknown.dwarf_1d342e::make_dispatcher
              ((anon_unknown_dwarf_1d342e *)local_48,this,kind,local_50);
    pdVar4 = std::unique_ptr<pstore::repo::dispatcher,_(anonymous_namespace)::nop_deleter>::
             operator->(local_48);
    iVar1 = (*pdVar4->_vptr_dispatcher[2])();
    std::unique_ptr<pstore::repo::dispatcher,_(anonymous_namespace)::nop_deleter>::~unique_ptr
              (local_48);
    this_local = (fragment *)(vStack_20 + CONCAT44(extraout_var,iVar1));
  }
  return (size_t)this_local;
}

Assistant:

std::size_t fragment::size_bytes () const {
    if (arr_.size () == 0) {
        return sizeof (*this);
    }
    auto const last_offset = arr_.back ();
    auto const last_section_kind = static_cast<section_kind> (arr_.get_indices ().back ());
    dispatcher_buffer buffer;
    auto const last_section_size =
        make_dispatcher (*this, last_section_kind, &buffer)->size_bytes ();
    return last_offset + last_section_size;
}